

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void do_cmd_lazymove_delay(char *name,wchar_t unused)

{
  char *str;
  ulong local_30;
  unsigned_long delay;
  undefined1 local_15;
  undefined1 auStack_14 [3];
  char tmp [4];
  _Bool res;
  wchar_t unused_local;
  char *name_local;
  
  _auStack_14 = unused;
  unique0x10000214 = name;
  memset((void *)((long)&delay + 7),0,4);
  strnfmt((char *)((long)&delay + 7),4,"%i",(ulong)(player->opts).lazymove_delay);
  screen_save();
  prt("",L'\x13',L'\0');
  prt("Command: Movement Delay Factor",L'\x14',L'\0');
  prt("New movement delay: ",L'\x15',L'\0');
  str = format("Current movement delay: %d (%d msec)",(ulong)(player->opts).lazymove_delay,
               (ulong)((uint)(player->opts).lazymove_delay * 10));
  prt(str,L'\x16',L'\0');
  prt("",L'\x17',L'\0');
  local_15 = askfor_aux((char *)((long)&delay + 7),4,askfor_aux_numbers);
  if ((bool)local_15) {
    local_30 = strtoul((char *)((long)&delay + 7),(char **)0x0,0);
    if (0xff < local_30) {
      local_30 = 0xff;
    }
    (player->opts).lazymove_delay = (uint8_t)local_30;
  }
  screen_load();
  return;
}

Assistant:

static void do_cmd_lazymove_delay(const char *name, int unused)
{
	bool res;
	char tmp[4] = "";

	strnfmt(tmp, sizeof(tmp), "%i", player->opts.lazymove_delay);

	screen_save();

	/* Prompt */
	prt("", 19, 0);
	prt("Command: Movement Delay Factor", 20, 0);
	prt("New movement delay: ", 21, 0);
	prt(format("Current movement delay: %d (%d msec)",
		player->opts.lazymove_delay, player->opts.lazymove_delay * 10),
		22, 0);
	prt("", 23, 0);

	/* Ask the user for a string */
	res = askfor_aux(tmp, sizeof(tmp), askfor_aux_numbers);

	/* Process input */
	if (res) {
		unsigned long delay = strtoul(tmp, NULL, 0);
		player->opts.lazymove_delay = (uint8_t) MIN(delay, 255);
	}

	screen_load();
}